

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# selu.cpp
# Opt level: O3

int __thiscall ncnn::SELU::forward_inplace(SELU *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  float fVar2;
  int iVar3;
  size_t sVar4;
  size_t sVar5;
  long lVar6;
  void *pvVar7;
  ulong uVar8;
  uint uVar9;
  float fVar10;
  
  iVar3 = bottom_top_blob->c;
  if (0 < (long)iVar3) {
    fVar1 = this->lambda;
    fVar2 = this->alpha;
    uVar9 = bottom_top_blob->h * bottom_top_blob->w;
    sVar4 = bottom_top_blob->cstep;
    sVar5 = bottom_top_blob->elemsize;
    pvVar7 = bottom_top_blob->data;
    lVar6 = 0;
    do {
      if (0 < (int)uVar9) {
        uVar8 = 0;
        do {
          fVar10 = *(float *)((long)pvVar7 + uVar8 * 4);
          if (0.0 <= fVar10) {
            fVar10 = fVar10 * this->lambda;
          }
          else {
            fVar10 = expf(fVar10);
            fVar10 = (fVar10 + -1.0) * fVar1 * fVar2;
          }
          *(float *)((long)pvVar7 + uVar8 * 4) = fVar10;
          uVar8 = uVar8 + 1;
        } while (uVar9 != uVar8);
      }
      lVar6 = lVar6 + 1;
      pvVar7 = (void *)((long)pvVar7 + sVar4 * sVar5);
    } while (lVar6 != iVar3);
  }
  return 0;
}

Assistant:

int SELU::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int size = w * h;
    float alphaxlambda = alpha * lambda;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        for (int i = 0; i < size; i++)
        {
            if (ptr[i] < 0.f)
                ptr[i] = static_cast<float>((exp(ptr[i]) - 1.f) * alphaxlambda);
            else
                ptr[i] *= lambda;
        }
    }

    return 0;
}